

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QColorDialogPrivate::releaseColorPicking(QColorDialogPrivate *this)

{
  QWidget *this_00;
  QColorPicker *this_01;
  QLabel *this_02;
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QString local_68;
  QArrayData *local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  this_01 = this->cp;
  if (this_01->crossVisible == false) {
    this_01->crossVisible = true;
    QWidget::update((QWidget *)this_01);
  }
  QObject::removeEventFilter(&this_00->super_QObject);
  QWidget::releaseMouse(this_00);
  QWidget::releaseKeyboard(this_00);
  QWidget::setAttribute(this_00,WA_MouseTracking,false);
  this_02 = this->lblScreenColorInfo;
  QVar1.m_data = (storage_type *)0x1;
  QVar1.m_size = (qsizetype)&local_48;
  QString::fromLatin1(QVar1);
  local_68.d.d = (Data *)local_48;
  local_68.d.ptr = pcStack_40;
  local_68.d.size = local_38;
  QLabel::setText(this_02,&local_68);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  QWidget::setDisabled((QWidget *)this->addCusBt,false);
  QWidget::setDisabled(&this->buttons->super_QWidget,false);
  QWidget::setDisabled((QWidget *)this->eyeDropperButton,false);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::releaseColorPicking()
{
    Q_Q(QColorDialog);
    cp->setCrossVisible(true);
    q->removeEventFilter(colorPickingEventFilter);
    q->releaseMouse();
#ifdef Q_OS_WIN32
    updateTimer->stop();
    dummyTransparentWindow.setVisible(false);
#endif
    q->releaseKeyboard();
    q->setMouseTracking(false);
    lblScreenColorInfo->setText("\n"_L1);
    addCusBt->setDisabled(false);
    buttons->setDisabled(false);
    eyeDropperButton->setDisabled(false);
}